

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qoffscreensurface.cpp
# Opt level: O1

void __thiscall QOffscreenSurface::destroy(QOffscreenSurface *this)

{
  long lVar1;
  long in_FS_OFFSET;
  undefined1 local_38 [16];
  undefined1 *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&this->field_0x8;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QPlatformSurfaceEvent::QPlatformSurfaceEvent
            ((QPlatformSurfaceEvent *)local_38,SurfaceAboutToBeDestroyed);
  QCoreApplication::sendEvent(&this->super_QObject,(QEvent *)local_38);
  if (*(long **)(lVar1 + 0x80) != (long *)0x0) {
    (**(code **)(**(long **)(lVar1 + 0x80) + 8))();
  }
  *(undefined8 *)(lVar1 + 0x80) = 0;
  if (*(QWindow **)(lVar1 + 0x88) != (QWindow *)0x0) {
    QWindow::destroy(*(QWindow **)(lVar1 + 0x88));
    if (*(long **)(lVar1 + 0x88) != (long *)0x0) {
      (**(code **)(**(long **)(lVar1 + 0x88) + 0x20))();
    }
    *(undefined8 *)(lVar1 + 0x88) = 0;
  }
  QPlatformSurfaceEvent::~QPlatformSurfaceEvent((QPlatformSurfaceEvent *)local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QOffscreenSurface::destroy()
{
    Q_D(QOffscreenSurface);

    QPlatformSurfaceEvent e(QPlatformSurfaceEvent::SurfaceAboutToBeDestroyed);
    QGuiApplication::sendEvent(this, &e);

    delete d->platformOffscreenSurface;
    d->platformOffscreenSurface = nullptr;
    if (d->offscreenWindow) {
        d->offscreenWindow->destroy();
        delete d->offscreenWindow;
        d->offscreenWindow = nullptr;
    }
}